

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_error.h
# Opt level: O3

ostream * jsonnet::internal::operator<<(ostream *o,StaticError *err)

{
  string local_30;
  
  StaticError::toString_abi_cxx11_(&local_30,err);
  std::__ostream_insert<char,std::char_traits<char>>
            (o,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return o;
}

Assistant:

static inline std::ostream &operator<<(std::ostream &o, const StaticError &err)
{
    o << err.toString();
    return o;
}